

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_cursor.c
# Opt level: O1

_Bool ts_tree_cursor_child_iterator_next
                (CursorChildIterator *self,TreeCursorEntry *result,_Bool *visible)

{
  Subtree *pSVar1;
  uint32_t uVar2;
  undefined4 uVar3;
  uint uVar4;
  SubtreeHeapData *pSVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  int iVar13;
  ulong uVar11;
  ulong uVar12;
  int iVar14;
  uint32_t uVar15;
  Length result_1;
  undefined4 uStack_1c;
  
  pSVar5 = (self->parent).ptr;
  if (pSVar5 != (SubtreeHeapData *)0x0) {
    uVar4 = self->child_index;
    if (uVar4 != pSVar5->child_count) {
      pSVar1 = (pSVar5->field_17).field_0.children + uVar4;
      uVar15 = (self->position).extent.column;
      uVar9 = (self->position).bytes;
      uVar10 = (self->position).extent.row;
      uVar2 = self->structural_child_index;
      result->subtree = pSVar1;
      (result->position).extent.column = uVar15;
      (result->position).bytes = uVar9;
      (result->position).extent.row = uVar10;
      result->child_index = uVar4;
      result->structural_child_index = uVar2;
      pSVar5 = pSVar1->ptr;
      if (((ulong)pSVar5 & 1) == 0) {
        uVar4 = (uint)*(ushort *)&pSVar5->field_0x2c;
      }
      else {
        uVar4 = (uint)((ulong)pSVar5 >> 1) & 0x7fffffff;
      }
      *visible = SUB41(uVar4 & 1,0);
      pSVar5 = pSVar1->ptr;
      if (((ulong)pSVar5 & 1) == 0) {
        uVar7 = *(uint *)&pSVar5->field_0x2c >> 2;
      }
      else {
        uVar7 = (uint)((ulong)pSVar5 >> 3) & 0x1fffffff;
      }
      if (((uVar7 & 1) == 0) && (self->alias_sequence != (TSSymbol *)0x0)) {
        *visible = (short)(uVar4 & 1) != 0 ||
                   self->alias_sequence[self->structural_child_index] != 0;
      }
      pSVar5 = pSVar1->ptr;
      if (((ulong)pSVar5 & 1) == 0) {
        uVar12._0_4_ = (pSVar5->size).bytes;
        uVar12._4_4_ = (pSVar5->size).extent.row;
        uVar4 = (pSVar5->size).extent.column;
        iVar13 = uVar12._4_4_;
      }
      else {
        uVar12 = (ulong)pSVar5 >> 0x18 & 0xff;
        uVar4 = (uint)uVar12;
        iVar13 = 0;
      }
      uVar3 = (self->position).bytes;
      uVar6 = (self->position).extent.row;
      iVar14 = (int)uVar12 + uVar3;
      uVar11 = CONCAT44((self->position).extent.column,uVar6) + CONCAT44(uVar4,iVar13);
      uVar12 = uVar11 & 0xffffffff | (ulong)uVar4 << 0x20;
      if (iVar13 == 0) {
        uVar12 = uVar11;
      }
      result_1.extent.row = (uint32_t)uVar12;
      result_1.extent.column = (uint32_t)(uVar12 >> 0x20);
      (self->position).bytes = iVar14;
      (self->position).extent.row = result_1.extent.row;
      (self->position).extent.column = result_1.extent.column;
      uVar4 = self->child_index + 1;
      self->child_index = uVar4;
      if ((uVar7 & 1) == 0) {
        self->structural_child_index = self->structural_child_index + 1;
      }
      if (((self->parent).ptr)->child_count <= uVar4) {
        return true;
      }
      pSVar5 = (((self->parent).ptr)->field_17).field_0.children[uVar4].ptr;
      if (((ulong)pSVar5 & 1) == 0) {
        uVar4 = (pSVar5->padding).bytes;
        uVar7 = (pSVar5->padding).extent.row;
        uVar15 = (pSVar5->padding).extent.column;
      }
      else {
        uVar4 = (uint)((ulong)pSVar5 >> 0x10) & 0xff;
        uVar8 = (uint)((ulong)pSVar5 >> 0x20);
        uVar7 = uVar8 >> 8 & 0xf;
        uVar15 = uVar8 & 0xff;
      }
      uVar12 = uVar12 + CONCAT44(uVar15,uVar7);
      uVar11 = uVar12 & 0xffffffff | (ulong)uVar15 << 0x20;
      if (uVar7 == 0) {
        uVar11 = uVar12;
      }
      result_1.extent.row = (uint32_t)uVar11;
      result_1.extent.column = (uint32_t)(uVar11 >> 0x20);
      (self->position).bytes = uVar4 + iVar14;
      (self->position).extent.row = result_1.extent.row;
      (self->position).extent.column = result_1.extent.column;
      return true;
    }
  }
  return false;
}

Assistant:

static inline bool ts_tree_cursor_child_iterator_next(CursorChildIterator *self,
                                                      TreeCursorEntry *result,
                                                      bool *visible) {
  if (!self->parent.ptr || self->child_index == self->parent.ptr->child_count) return false;
  const Subtree *child = &self->parent.ptr->children[self->child_index];
  *result = (TreeCursorEntry) {
    .subtree = child,
    .position = self->position,
    .child_index = self->child_index,
    .structural_child_index = self->structural_child_index,
  };
  *visible = ts_subtree_visible(*child);
  bool extra = ts_subtree_extra(*child);
  if (!extra && self->alias_sequence) {
    *visible |= self->alias_sequence[self->structural_child_index];
  }

  self->position = length_add(self->position, ts_subtree_size(*child));
  self->child_index++;
  if (!extra) self->structural_child_index++;

  if (self->child_index < self->parent.ptr->child_count) {
    Subtree next_child = self->parent.ptr->children[self->child_index];
    self->position = length_add(self->position, ts_subtree_padding(next_child));
  }

  return true;
}